

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_functions.cpp
# Opt level: O1

ScalarFunction * duckdb::InSearchPathFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_b9;
  code *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *pcStack_a0;
  LogicalType local_90 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_78;
  LogicalType local_60 [24];
  LogicalType local_48 [24];
  LogicalType local_30 [24];
  
  duckdb::LogicalType::LogicalType(local_48,VARCHAR);
  duckdb::LogicalType::LogicalType(local_30,VARCHAR);
  __l._M_len = 2;
  __l._M_array = local_48;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_78,__l,&local_b9);
  duckdb::LogicalType::LogicalType(local_90,BOOLEAN);
  uStack_b0 = 0;
  local_b8 = InSearchPathFunction;
  pcStack_a0 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_60,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_60);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_78);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_48 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  in_RDI->field_0xa8 = 2;
  return in_RDI;
}

Assistant:

ScalarFunction InSearchPathFun::GetFunction() {
	ScalarFunction in_search_path({LogicalType::VARCHAR, LogicalType::VARCHAR}, LogicalType::BOOLEAN,
	                              InSearchPathFunction);
	in_search_path.stability = FunctionStability::CONSISTENT_WITHIN_QUERY;
	return in_search_path;
}